

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManPropagate2(Cbs2_Man_t *p,int Level)

{
  int *piVar1;
  char cVar2;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  uint uVar22;
  
  iVar16 = (p->pProp).iHead;
  lVar10 = (long)iVar16;
  iVar5 = (p->pProp).iTail;
  if ((iVar16 < iVar5) && (uVar7 = (p->pProp).pData[lVar10], uVar7 != 0)) {
    do {
      if ((int)uVar7 < 0) {
LAB_0071f996:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      if ((p->vWatches).nSize <= (int)uVar7) {
LAB_0071f9b5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar14 = (p->vWatches).pArray;
      iVar16 = piVar14[uVar7];
      if (iVar16 != 0) {
        uVar22 = uVar7 ^ 1;
        piVar14 = piVar14 + uVar7;
        piVar21 = (p->pClauses).pData;
        do {
          piVar1 = piVar21 + iVar16;
          iVar5 = *piVar1;
          lVar9 = (long)iVar5;
          p->nPropCalls[1] = p->nPropCalls[1] + 1;
          if (piVar1[1] == uVar22) {
            piVar1[1] = piVar1[2];
            piVar1[2] = uVar22;
            *(ulong *)(piVar1 + lVar9 + 1) =
                 CONCAT44((int)*(undefined8 *)(piVar1 + lVar9 + 1),
                          (int)((ulong)*(undefined8 *)(piVar1 + lVar9 + 1) >> 0x20));
          }
          if (piVar1[2] != uVar22) {
            __assert_fail("pLits[1] == LitF",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x350,"int Cbs2_ManPropagateClauses(Cbs2_Man_t *, int, int)");
          }
          uVar8 = piVar1[1];
          if ((int)uVar8 < 0) goto LAB_0071f8dc;
          uVar15 = (p->vAssign).nSize;
          if ((int)uVar15 <= (int)(uVar8 >> 1)) goto LAB_0071f8bd;
          pcVar3 = (p->vAssign).pArray;
          cVar2 = pcVar3[uVar8 >> 1];
          if ((uVar8 & 1 ^ (int)cVar2) == 1) {
            piVar14 = piVar1 + (long)*piVar1 + 2;
          }
          else {
            if (2 < iVar5) {
              lVar19 = 0;
              do {
                uVar12 = piVar21[(long)iVar16 + lVar19 + 3];
                if ((int)uVar12 < 0) goto LAB_0071f8dc;
                if (uVar15 <= uVar12 >> 1) goto LAB_0071f8bd;
                if ((uVar12 & 1) != (int)pcVar3[uVar12 >> 1]) {
                  piVar21[(long)iVar16 + 2] = uVar12;
                  piVar1[lVar19 + 3] = uVar22;
                  *piVar14 = piVar1[(long)piVar21[iVar16] + 2];
                  uVar8 = piVar21[(long)iVar16 + 2];
                  if ((int)uVar8 < 0) goto LAB_0071f996;
                  uVar20 = (ulong)uVar8 ^ 1;
                  if ((p->vWatches).nSize <= (int)uVar20) goto LAB_0071f9b5;
                  piVar4 = (p->vWatches).pArray;
                  uVar15 = uVar8;
                  if (piVar4[uVar20] == 0) {
                    Vec_IntPush(&p->vWatchUpds,(int)uVar20);
                    uVar15 = piVar1[2];
                  }
                  uVar12 = uVar15;
                  if ((piVar1[1] != uVar8) && (uVar12 = uVar8, uVar15 != uVar8)) {
                    __assert_fail("Lit == pLits[0] || Lit == pLits[1]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                                  ,0x2a3,"void Cbs2_ManWatchClause(Cbs2_Man_t *, int, int)");
                  }
                  piVar21 = (p->pClauses).pData;
                  piVar21[(int)((uint)(uVar12 == uVar8) + iVar16 + 1 + piVar21[iVar16])] =
                       piVar4[uVar20];
                  piVar4[uVar20] = iVar16;
                  goto LAB_0071f67f;
                }
                lVar19 = lVar19 + 1;
              } while (lVar9 + -2 != lVar19);
            }
            if (cVar2 < '\x02') {
              if ((uVar8 & 1) == (int)cVar2) {
                p->nClauseConf = p->nClauseConf + 1;
                if (piVar1[1] < 0) goto LAB_0071f8dc;
                iVar16 = Cbs2_ManAnalyze(p,Level,(uint)piVar1[1] >> 1,0,iVar16);
                if (iVar16 != 0) {
                  return iVar16;
                }
                break;
              }
            }
            else {
              Cbs2_ManAssign(p,uVar8,Level,0,iVar16);
              piVar21 = (p->pClauses).pData;
              piVar14 = piVar21 + iVar16 + (long)piVar21[iVar16] + 2;
            }
          }
LAB_0071f67f:
          iVar16 = *piVar14;
        } while (iVar16 != 0);
      }
      uVar7 = uVar7 >> 1;
      if ((p->vFanout0).nSize <= (int)uVar7) {
LAB_0071f91a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      for (uVar22 = (p->vFanout0).pArray[uVar7]; uVar22 != 0; uVar22 = (p->vFanoutN).pArray[uVar22])
      {
        if ((int)uVar22 < 0) {
LAB_0071f8dc:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar15 = uVar22 >> 1;
        uVar8 = (p->vAssign).nSize;
        if ((int)uVar8 <= (int)uVar15) goto LAB_0071f8bd;
        pcVar3 = (p->vAssign).pArray;
        if (pcVar3[uVar15] < '\x02') {
          iVar16 = Cbs2_ManPropagateOne(p,uVar15,Level);
          if (iVar16 != 0) {
            return iVar16;
          }
        }
        else {
          if (p->pAig->nObjs <= (int)uVar15) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar6 = p->pAig->pObjs + uVar15;
          if (((ulong)pGVar6 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x434,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
          }
          uVar20 = *(ulong *)pGVar6;
          uVar12 = (uint)uVar20;
          if (((int)uVar12 < 0) || ((uVar12 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                          ,0x435,"void Cbs2_ManPropagateUnassigned(Cbs2_Man_t *, int, int)");
          }
          uVar12 = uVar15 - (uVar12 & 0x1fffffff);
          if (((int)uVar12 < 0) || (uVar8 <= uVar12)) {
LAB_0071f8bd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          uVar18 = (uint)(uVar20 >> 0x20);
          uVar17 = uVar15 - (uVar18 & 0x1fffffff);
          if (((int)uVar17 < 0) || (uVar8 <= uVar17)) goto LAB_0071f8bd;
          uVar11 = (uint)pcVar3[uVar12];
          uVar13 = (uint)(uVar20 >> 0x1d) & 1;
          uVar12 = (uint)pcVar3[uVar17];
          uVar8 = uVar18 >> 0x1d & 1;
          p->nPropCalls[2] = p->nPropCalls[2] + 1;
          if ((uVar13 == uVar11) && (uVar8 == uVar12)) {
            uVar8 = uVar22 | 1;
LAB_0071f7a6:
            uVar12 = (uint)*(ulong *)pGVar6;
            iVar16 = uVar15 - ((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff);
          }
          else {
            if (uVar13 == uVar11) {
              uVar12 = *(uint *)pGVar6;
            }
            else {
              if (uVar8 != uVar12) {
                if (((uVar13 ^ uVar11) != 1) || ((uVar8 ^ uVar12) != 1)) goto LAB_0071f80b;
                uVar8 = uVar22 & 0x7ffffffe;
                goto LAB_0071f7a6;
              }
              uVar12 = *(uint *)&pGVar6->field_0x4;
            }
            uVar8 = uVar22 | 1;
            iVar16 = 0;
          }
          Cbs2_ManAssign(p,uVar8,Level,uVar15 - (uVar12 & 0x1fffffff),iVar16);
        }
LAB_0071f80b:
        if ((p->vFanoutN).nSize <= (int)uVar22) goto LAB_0071f91a;
      }
      iVar16 = Cbs2_ManPropagateOne(p,uVar7,Level);
      if (iVar16 != 0) {
        return iVar16;
      }
      lVar10 = lVar10 + 1;
      iVar5 = (p->pProp).iTail;
    } while ((lVar10 < iVar5) && (uVar7 = (p->pProp).pData[lVar10], uVar7 != 0));
  }
  (p->pProp).iHead = iVar5;
  return 0;
}

Assistant:

int Cbs2_ManPropagate2( Cbs2_Man_t * p, int Level )
{
    int i, iLit, iFan, hClause;
    Cbs2_QueForEachEntry( p->pProp, iLit, i )
    {
        if ( (hClause = Cbs2_ManPropagateClauses(p, Level, iLit)) )
            return hClause;
        Cbs2_ObjForEachFanout( p, Abc_Lit2Var(iLit), iFan )
        {
            int iFanout = Abc_Lit2Var(iFan);
            if ( !Cbs2_VarIsAssigned(p, iFanout) )
                Cbs2_ManPropagateUnassigned( p, iFanout, Level );
            else if ( (hClause = Cbs2_ManPropagateOne(p, iFanout, Level)) )
                return hClause;
        }
        if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
            return hClause;
    }
    p->pProp.iHead = p->pProp.iTail;
    return 0;
}